

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogTailIdx.cpp
# Opt level: O2

list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
liblogger::LogTailIdx::GetList_abi_cxx11_
          (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,LogTailIdx *this,uint64_t *idx,int maxitems)

{
  ulong uVar1;
  ulong uVar2;
  mapped_type *__x;
  int iVar3;
  LogManagerScopedLock lock;
  LogManagerScopedLock local_41;
  ulong *local_40;
  ulong local_38;
  
  LogManager::Lock();
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node._M_size = 0;
  local_41.m_locked = true;
  uVar1 = *idx;
  if (this->m_current < uVar1) {
    *idx = this->m_current;
  }
  else {
    uVar2 = *(ulong *)((this->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1);
    local_38 = uVar1;
    if (uVar1 < uVar2) {
      *idx = uVar2;
      local_38 = uVar2;
    }
    iVar3 = 0;
    local_40 = idx;
    while( true ) {
      if (this->m_current <= local_38) break;
      if (maxitems < iVar3 && 0 < maxitems) {
        *local_40 = local_38;
        LogManager::Unlock();
        goto LAB_0013fd0e;
      }
      __x = std::
            map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->m_data,&local_38);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,__x);
      iVar3 = iVar3 + 1;
      local_38 = local_38 + 1;
    }
    *local_40 = this->m_current;
  }
LAB_0013fd0e:
  LogManagerScopedLock::~LogManagerScopedLock(&local_41);
  return __return_storage_ptr__;
}

Assistant:

std::list<std::string> LogTailIdx::GetList(uint64_t *idx, int maxitems) {
	LogManagerScopedLock lock = LogManagerScopedLock();
	std::list<std::string> lst;

	if (*idx > m_current)
	{
		*idx = m_current;
		return lst;
	}

	//skip idx to first item in case it has not been used in a while
	std::map<uint64_t, std::string>::iterator it = m_data.begin();
	if (*idx < it->first)
	{
		*idx = it->first;
	}

	int count = 0;
	for(uint64_t i=*idx;i<m_current;i++)
	{
		if (maxitems > 0 && count > maxitems)
		{
			*idx = i;
			LogManager::Unlock();
			return lst;
		}
		lst.push_back(m_data[i]);
		count++;
	}
	*idx = m_current;
	return lst;
}